

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O3

ssize_t __thiscall
LatencySimulator::send(LatencySimulator *this,int __fd,void *__buf,size_t __n,int __flags)

{
  DelayTunnel *pDVar1;
  uint32_t uVar2;
  int iVar3;
  ulong uVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  size_t *psVar7;
  int iVar8;
  
  if (__fd == 1) {
    this->tx1 = this->tx1 + 1;
    uVar4 = Random::random(&this->r12);
    if ((int)uVar4 < this->lostrate) {
      return uVar4;
    }
    if (this->nmax <=
        (int)(this->p12).super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>._M_impl.
             _M_node._M_size) {
      return (ulong)(uint)this->nmax;
    }
  }
  else {
    this->tx2 = this->tx2 + 1;
    uVar4 = Random::random(&this->r21);
    if ((int)uVar4 < this->lostrate) {
      return uVar4;
    }
    if (this->nmax <=
        (int)(this->p21).super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>._M_impl.
             _M_node._M_size) {
      return (ulong)(uint)this->nmax;
    }
  }
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5->_M_next = (_List_node_base *)&PTR__DelayPacket_00106d68;
  iVar8 = (int)__n;
  uVar4 = 0xffffffffffffffff;
  if (-1 < iVar8) {
    uVar4 = (long)iVar8;
  }
  p_Var6 = (_List_node_base *)operator_new__(uVar4);
  p_Var5->_M_prev = p_Var6;
  *(int *)&p_Var5[1]._M_next = iVar8;
  if (__buf != (void *)0x0) {
    memcpy(p_Var6,__buf,(long)iVar8);
  }
  uVar2 = iclock();
  this->current = uVar2;
  iVar8 = this->rttmin;
  if (iVar8 < this->rttmax) {
    iVar3 = rand();
    uVar2 = this->current;
    iVar8 = iVar8 + iVar3 % (this->rttmax - this->rttmin);
  }
  *(uint32_t *)((long)&p_Var5[1]._M_next + 4) = uVar2 + iVar8;
  p_Var6 = (_List_node_base *)operator_new(0x18);
  p_Var6[1]._M_next = p_Var5;
  pDVar1 = &this->p12;
  if (__fd != 1) {
    pDVar1 = &this->p21;
  }
  psVar7 = &(pDVar1->super__List_base<DelayPacket_*,_std::allocator<DelayPacket_*>_>)._M_impl.
            _M_node._M_size;
  uVar4 = std::__detail::_List_node_base::_M_hook(p_Var6);
  *psVar7 = *psVar7 + 1;
  return uVar4;
}

Assistant:

void send(int peer, const void *data, int size) {
//        DelayTunnel &tunnel = p12;
//        Random &r = r12;
//        tx1++;
        DelayTunnel *tunnel = &p12;
        if (peer == 1) {
            tx1++;
            if (r12.random() < lostrate) {
//                fprintf(stderr, "drop. lost rate test.\n");
                return;
            }
            if ((int) p12.size() >= nmax) return;
        } else {
            tunnel = &p21;
            tx2++;
            if (r21.random() < lostrate) {
//                fprintf(stderr, "drop. lost rate test.\n");
                return;  //todo: uncoment for lost rate test
            }
            if ((int) p21.size() >= nmax) return;
        }


        DelayPacket *pkt = new DelayPacket(size, data);
        current = iclock();
        uint32_t delay = rttmin;
        if (rttmax > rttmin) delay += rand() % (rttmax - rttmin);
//		fprintf(stderr, "delay: %dms\n", delay);
        pkt->setts(current + delay);
        if (peer == 1) {
//            if (!(tx1 % 3)) {    // simulate packet loss
//                fprintf(stderr, "peer 1 send: drop packt. tx1 = %d\n", tx1);
//                delete pkt;
//                return;
//            }
            p12.push_back(pkt);
        } else {
//            if (!(tx2 % 5)) {
//                fprintf(stderr, "peer 2 send: drop packt. tx2 = %d\n", tx2);
//                delete pkt;
//                return;
//            }
            p21.push_back(pkt);
        }

//        fprintf(stderr, "send, tunnel: %p, size: %d, pkt: %p, _ptr: %p\n", tunnel, tunnel->size(),  pkt, pkt->ptr());

    }